

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::LogWarning(Parser *this,char *szWarn)

{
  Logger *this_00;
  char szTemp [1024];
  char acStack_408 [1024];
  
  if (szWarn != (char *)0x0) {
    snprintf(acStack_408,0x400,"Line %u: %s",(ulong)this->iLineNumber,szWarn);
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,acStack_408);
    return;
  }
  __assert_fail("__null != szWarn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASEParser.cpp"
                ,0x8f,"void Assimp::ASE::Parser::LogWarning(const char *)");
}

Assistant:

void Parser::LogWarning(const char* szWarn)
{
    ai_assert(NULL != szWarn);

    char szTemp[1024];
#if _MSC_VER >= 1400
    sprintf_s(szTemp, "Line %u: %s",iLineNumber,szWarn);
#else
    ai_snprintf(szTemp,1024,"Line %u: %s",iLineNumber,szWarn);
#endif

    // output the warning to the logger ...
    ASSIMP_LOG_WARN(szTemp);
}